

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O1

bool parse_float(uint8_t *buf,ParsedJson *pj,uint32_t offset,bool found_minus)

{
  uint64_t *puVar1;
  long lVar2;
  uint uVar3;
  byte *pbVar4;
  undefined7 in_register_00000009;
  byte bVar5;
  byte *pbVar6;
  byte bVar7;
  ulong uVar8;
  uint uVar9;
  byte bVar10;
  byte bVar11;
  byte *pbVar12;
  bool bVar13;
  double dVar14;
  double dVar15;
  
  uVar8 = CONCAT71(in_register_00000009,found_minus) & 0xffffffff;
  lVar2 = uVar8 + offset;
  if (buf[uVar8 + offset] == '0') {
    pbVar4 = buf + lVar2 + 1;
    dVar14 = 0.0;
  }
  else {
    dVar14 = (double)(byte)(buf[uVar8 + offset] - 0x30);
    pbVar4 = buf + lVar2 + 1;
    bVar5 = buf[lVar2 + 1];
    while ((byte)(bVar5 - 0x30) < 10) {
      dVar14 = dVar14 * 10.0 + (double)(int)(char)(bVar5 - 0x30);
      pbVar6 = pbVar4 + 1;
      pbVar4 = pbVar4 + 1;
      bVar5 = *pbVar6;
    }
  }
  if (*pbVar4 == 0x2e) {
    bVar5 = pbVar4[1] - 0x30;
    if (bVar5 < 10) {
      dVar14 = (double)bVar5 * 0.1 + dVar14;
      pbVar6 = pbVar4 + 2;
      pbVar4 = pbVar4 + 2;
      bVar7 = *pbVar6 - 0x30;
      if (bVar7 < 10) {
        dVar15 = 0.1;
        do {
          dVar15 = dVar15 * 0.1;
          dVar14 = (double)(int)(char)bVar7 * dVar15 + dVar14;
          pbVar6 = pbVar4 + 1;
          pbVar4 = pbVar4 + 1;
          bVar7 = *pbVar6 - 0x30;
        } while (bVar7 < 10);
      }
    }
    else {
      pbVar4 = pbVar4 + 1;
    }
    if (9 < bVar5) {
      return false;
    }
  }
  if ((*pbVar4 | 0x20) != 0x65) goto LAB_001087ac;
  bVar13 = (pbVar4[1] - 0x2b & 0xfd) == 0;
  pbVar6 = pbVar4 + 1;
  if (bVar13) {
    pbVar6 = pbVar4 + 2;
  }
  bVar5 = pbVar4[(ulong)bVar13 + 1] - 0x30;
  if (bVar5 < 10) {
    bVar7 = pbVar6[1] - 0x30;
    pbVar12 = pbVar6 + 2;
    if (9 < bVar7) {
      pbVar12 = pbVar6 + 1;
    }
    bVar10 = pbVar6[(ulong)(bVar7 < 10) + 1] - 0x30;
    bVar11 = pbVar12[bVar10 < 10] - 0x30;
    pbVar6 = pbVar12 + (ulong)(bVar11 < 10) + (ulong)(bVar10 < 10);
    if ((byte)(*pbVar6 - 0x30) < 10) goto LAB_001087a2;
    uVar9 = (uint)bVar7 + (uint)bVar5 * 10;
    if (9 < bVar7) {
      uVar9 = (uint)bVar5;
    }
    uVar3 = (uint)bVar10 + uVar9 * 10;
    if (9 < bVar10) {
      uVar3 = uVar9;
    }
    uVar9 = (uint)bVar11 + uVar3 * 10;
    if (9 < bVar11) {
      uVar9 = uVar3;
    }
    uVar3 = -uVar9;
    if (pbVar4[1] != 0x2d) {
      uVar3 = uVar9;
    }
    bVar13 = uVar3 + 0x134 < 0x269;
    pbVar4 = pbVar6;
    if (bVar13) {
      dVar14 = dVar14 * power_of_ten[uVar3 + 0x134];
      bVar13 = true;
    }
  }
  else {
LAB_001087a2:
    bVar13 = false;
    pbVar4 = pbVar6;
  }
  if (!bVar13) {
    return false;
  }
LAB_001087ac:
  if (structural_or_whitespace_negated[*pbVar4] != 0) {
    return false;
  }
  if (found_minus) {
    dVar14 = -dVar14;
  }
  puVar1 = pj->tape;
  uVar9 = pj->current_loc;
  pj->current_loc = uVar9 + 1;
  puVar1[uVar9] = 0x6400000000000000;
  pj->current_loc = uVar9 + 2;
  puVar1[uVar9 + 1] = (uint64_t)dVar14;
  return structural_or_whitespace[*pbVar4] != 0;
}

Assistant:

static never_inline bool
parse_float(const uint8_t *const buf,
                          ParsedJson &pj, const uint32_t offset,
                          bool found_minus) {
  const char *p = reinterpret_cast<const char *>(buf + offset);
  bool negative = false;
  if (found_minus) {
    ++p;
    negative = true;
  }
  double i;
  if (*p == '0') { // 0 cannot be followed by an integer
    ++p;
    i = 0;
  } else {
    unsigned char digit = *p - '0';
    i = digit;
    p++;
    while (is_integer(*p)) {
      digit = *p - '0';
      i = 10 * i + digit;
      ++p;
    }
  }
  if ('.' == *p) {
    ++p;
    double fractionalweight = 1;
    if(is_integer(*p)) {
      unsigned char digit = *p - '0';
      ++p;
      fractionalweight *= 0.1;
      i = i + digit * fractionalweight;
    } else {
#ifdef JSON_TEST_NUMBERS // for unit testing
      foundInvalidNumber(buf + offset);
#endif
      return false;
    }
    while (is_integer(*p)) {
      unsigned char digit = *p - '0';
      ++p;
      fractionalweight *= 0.1;
      i = i + digit * fractionalweight;
    }
  }
  if (('e' == *p) || ('E' == *p)) {
    ++p;
    bool negexp = false;
    if ('-' == *p) {
      negexp = true;
      ++p;
    } else if ('+' == *p) {
      ++p;
    }
    if (!is_integer(*p)) {
#ifdef JSON_TEST_NUMBERS // for unit testing
      foundInvalidNumber(buf + offset);
#endif
      return false;
    }
    unsigned char digit = *p - '0';
    int64_t expnumber = digit; // exponential part
    p++;
    if (is_integer(*p)) {
      digit = *p - '0';
      expnumber = 10 * expnumber + digit;
      ++p;
    }
    if (is_integer(*p)) {
      digit = *p - '0';
      expnumber = 10 * expnumber + digit;
      ++p;
    }
    if (is_integer(*p)) {
      digit = *p - '0';
      expnumber = 10 * expnumber + digit;
      ++p;
    }
    if (is_integer(*p)) {
// we refuse to parse this
#ifdef JSON_TEST_NUMBERS // for unit testing
      foundInvalidNumber(buf + offset);
#endif
      return false;
    }
    int exponent = (negexp ? -expnumber : expnumber);
    if ((exponent > 308) || (exponent < -308)) {
// we refuse to parse this
#ifdef JSON_TEST_NUMBERS // for unit testing
      foundInvalidNumber(buf + offset);
#endif
      return false;
    }
    i *= power_of_ten[308 + exponent];
  }
  if(is_not_structural_or_whitespace(*p)) {
    return false;
  }
  double d = negative ? -i : i;
  pj.write_tape_double(d);
#ifdef JSON_TEST_NUMBERS // for unit testing
  foundFloat(d, buf + offset);
#endif
  return is_structural_or_whitespace(*p);
}